

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_videos_worth_spreading.cpp
# Opt level: O1

void solve_videos_worth_spreading(void)

{
  Cache *cache;
  Video *video;
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < num_caches) {
    lVar5 = 0;
    do {
      cache = caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      compute(cache);
      if (sorted_aggregate_videos.
          super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sorted_aggregate_videos.
          super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar3 = 8;
        uVar4 = 0;
        do {
          video = *(Video **)
                   ((long)&(sorted_aggregate_videos.
                            super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar3);
          if (((mlc.super__Base_bitset<1563UL>._M_w[(ulong)(long)video->id >> 6] >>
                ((long)video->id & 0x3fU) & 1) != 0) && (video->size <= cache->remaining)) {
            Cache::add_video(cache,video);
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar4 < (ulong)((long)sorted_aggregate_videos.
                                       super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)sorted_aggregate_videos.
                                       super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < num_caches);
  }
  plVar1 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cerr,
                              (*caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl
                                .super__Vector_impl_data._M_start)->remaining);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void solve_videos_worth_spreading() {
    for (int cache_id = 0; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        compute(cache);
        for (int i = 0; i < sorted_aggregate_videos.size(); ++i) {
            Video *video = sorted_aggregate_videos[i].second;
            if (exists(cache, video) && cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }

    cerr << caches[0]->remaining << endl;
    cerr << caches[0]->videos.size() << endl;
}